

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepTiled.cpp
# Opt level: O0

void testCopyDeepTiled(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  string *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  exception *e;
  int numThreads;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing raw copy in DeepTiledInput/OutputFile ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_95130::readCopyWriteTest(unaff_retaddr_00,unaff_retaddr,in_RDI);
  anon_unknown.dwarf_95130::readCopyWriteTest(unaff_retaddr_00,unaff_retaddr,in_RDI);
  anon_unknown.dwarf_95130::readCopyWriteTest(unaff_retaddr_00,unaff_retaddr,in_RDI);
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testCopyDeepTiled (const std::string& tempDir)
{
    try
    {
        cout << "Testing raw copy in DeepTiledInput/OutputFile " << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        readCopyWriteTest (3, 1, tempDir);
        readCopyWriteTest (5, 2, tempDir);
        readCopyWriteTest (11, 3, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}